

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall tinyusdz::crate::CrateReader::ReadValueRep(CrateReader *this,ValueRep *rep)

{
  bool bVar1;
  ostream *poVar2;
  string local_350;
  ostringstream local_330 [8];
  ostringstream ss_e_1;
  string local_1b8;
  ostringstream local_198 [8];
  ostringstream ss_e;
  ValueRep *rep_local;
  CrateReader *this_local;
  
  bVar1 = StreamReader::read8(this->_sr,&rep->data);
  if (bVar1) {
    this->_memoryUsage = this->_memoryUsage + 8;
    if ((this->_config).maxMemoryBudget < this->_memoryUsage) {
      ::std::__cxx11::ostringstream::ostringstream(local_330);
      poVar2 = ::std::operator<<((ostream *)local_330,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,"[Crate]");
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ReadValueRep");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x124);
      ::std::operator<<(poVar2," ");
      poVar2 = ::std::operator<<((ostream *)local_330,"Reached to max memory budget.");
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,&local_350);
      ::std::__cxx11::string::~string((string *)&local_350);
      this_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_330);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadValueRep");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x120);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_198,"Failed to read ValueRep.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1b8);
    ::std::__cxx11::string::~string((string *)&local_1b8);
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CrateReader::ReadValueRep(crate::ValueRep *rep) {
  if (!_sr->read8(reinterpret_cast<uint64_t *>(rep))) {
    PUSH_ERROR("Failed to read ValueRep.");
    return false;
  }

  CHECK_MEMORY_USAGE(sizeof(uint64_t));

  DCOUT("ValueRep value = " << rep->GetData());

  return true;
}